

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::NLProblemBuilder<StrictMockProblemBuilder>::AddVariables
          (NLProblemBuilder<StrictMockProblemBuilder> *this,NLHeader *h)

{
  Argument1 AVar1;
  Argument1 gmock_a1;
  Error *this_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar2 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_cons;
  iVar4 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_objs;
  if (iVar4 < iVar2) {
    iVar4 = iVar2;
  }
  if (iVar4 != 0) {
    iVar5 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_both -
            (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_both;
    MockProblemBuilder::AddVars
              (&(this->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder,
               iVar5,CONTINUOUS);
    AVar1 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_both;
    MockProblemBuilder::AddVars
              (&(this->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder,
               AVar1,INTEGER);
    iVar2 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_cons -
            ((h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_both +
            (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_cons);
    MockProblemBuilder::AddVars
              (&(this->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder,
               iVar2,CONTINUOUS);
    gmock_a1 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_cons;
    MockProblemBuilder::AddVars
              (&(this->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder,
               gmock_a1,INTEGER);
    iVar3 = iVar2 + iVar5 + AVar1 + gmock_a1;
    iVar2 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_objs;
    iVar5 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_cons;
    iVar6 = iVar2 - iVar5;
    if (iVar6 != 0 && iVar5 <= iVar2) {
      iVar6 = iVar6 - (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_objs;
      MockProblemBuilder::AddVars
                (&(this->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder,
                 iVar6,CONTINUOUS);
      AVar1 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_objs;
      MockProblemBuilder::AddVars
                (&(this->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder,
                 AVar1,INTEGER);
      iVar3 = iVar3 + iVar6 + AVar1;
    }
    if (iVar4 != iVar3) {
      this_00 = (Error *)__cxa_allocate_exception(0x18);
      Error::Error(this_00,(CStringRef)0x21a2d6,-1);
      goto LAB_001c5eac;
    }
  }
  iVar2 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_vars -
          ((h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_integer_vars + iVar4 +
          (h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_binary_vars);
  MockProblemBuilder::AddVars
            (&(this->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder,iVar2,
             CONTINUOUS);
  iVar5 = (h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_binary_vars +
          (h->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_integer_vars;
  MockProblemBuilder::AddVars
            (&(this->builder_->super_StrictMock<MockProblemBuilder>).super_MockProblemBuilder,iVar5,
             INTEGER);
  if ((h->super_NLProblemInfo).super_NLProblemInfo_C.num_vars == iVar5 + iVar4 + iVar2) {
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x18);
  Error::Error(this_00,(CStringRef)0x21a2fd,-1);
LAB_001c5eac:
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

void AddVariables(const NLHeader& h) {
    // Distinguish NL variable order
    // See D.M.Gay, Hooking Your Solver to AMPL;
    //     D.M.Gay, Writing .NL Files;
    // and, e.g.,
    // github.com/jump-dev/MathOptInterface.jl/blob/master/src/FileFormats/NL/README.md
    int k=0;                             // current block position
    const int num_nl_vars = std::max(h.num_nl_vars_in_cons,
                                     h.num_nl_vars_in_objs);
    if (num_nl_vars) {
      DoAddVars(h.num_nl_vars_in_both - h.num_nl_integer_vars_in_both,
              var::CONTINUOUS, k);
      DoAddVars(h.num_nl_integer_vars_in_both,
              var::INTEGER, k);
      DoAddVars(h.num_nl_vars_in_cons -
              (h.num_nl_vars_in_both + h.num_nl_integer_vars_in_cons),
              var::CONTINUOUS, k);
      DoAddVars(h.num_nl_integer_vars_in_cons,
              var::INTEGER, k);
      int num_nl_vars_in_objs_only =
          std::max(0, h.num_nl_vars_in_objs - h.num_nl_vars_in_cons);
      if (num_nl_vars_in_objs_only) {
        DoAddVars(num_nl_vars_in_objs_only - h.num_nl_integer_vars_in_objs,
                var::CONTINUOUS, k);
        DoAddVars(h.num_nl_integer_vars_in_objs,
                var::INTEGER, k);
      }
    }
    MP_ASSERT_ALWAYS(num_nl_vars == k, "NLProblemBuilder: num_nl_vars mismatch");
    DoAddVars(h.num_vars -
            (num_nl_vars +
             h.num_linear_integer_vars + h.num_linear_binary_vars),
            var::CONTINUOUS, k);
    DoAddVars(h.num_linear_integer_vars + h.num_linear_binary_vars,
            var::INTEGER, k);
    MP_ASSERT_ALWAYS(h.num_vars == k, "NLProblemBuilder: num_vars mismatch");
  }